

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O0

void __thiscall GLFlat::SetupSubsectorLights(GLFlat *this,int pass,subsector_t *sub,int *dli)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  int d;
  double planeh;
  ADynamicLight *local_50;
  ADynamicLight *light;
  FLightNode *node;
  Plane p;
  int *dli_local;
  subsector_t *sub_local;
  int pass_local;
  GLFlat *this_local;
  
  p._12_8_ = dli;
  Plane::Plane((Plane *)((long)&node + 4));
  if (this->renderstyle != STYLE_Add) {
    if ((p._12_8_ == 0) || (*(int *)p._12_8_ == -1)) {
      FDynLightData::Clear(&lightdata);
      light = (ADynamicLight *)sub->lighthead;
      while (light != (ADynamicLight *)0x0) {
        local_50 = *(ADynamicLight **)
                    &(light->super_AActor).super_DThinker.super_DObject.ObjectFlags;
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)((long)&planeh + 4),
                   (int)local_50 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&planeh + 4));
        if (uVar3 == 0) {
          iter_dlightf = iter_dlightf + 1;
          dVar4 = secplane_t::ZatPoint(&(this->plane).plane,&local_50->super_AActor);
          bVar1 = FBoolCVar::operator_cast_to_bool(&gl_lights_checkside);
          if ((!bVar1) ||
             (((dVar5 = AActor::Z(&local_50->super_AActor), dVar5 <= dVar4 ||
               ((this->ceiling & 1U) == 0)) &&
              ((dVar5 = AActor::Z(&local_50->super_AActor), dVar4 <= dVar5 ||
               ((this->ceiling & 1U) != 0)))))) {
            Plane::Set((Plane *)((long)&node + 4),&(this->plane).plane);
            gl_GetLight(sub->sector->PortalGroup,(Plane *)((long)&node + 4),local_50,false,
                        &lightdata);
            light = (ADynamicLight *)(light->super_AActor).super_DThinker.super_DObject.GCNext;
          }
          else {
            light = (ADynamicLight *)(light->super_AActor).super_DThinker.super_DObject.GCNext;
          }
        }
        else {
          light = (ADynamicLight *)(light->super_AActor).super_DThinker.super_DObject.GCNext;
        }
      }
      iVar2 = FLightBuffer::UploadLights(GLRenderer->mLights,&lightdata);
      if (pass == 1) {
        FLightBuffer::StoreIndex(GLRenderer->mLights,iVar2);
      }
      else {
        FRenderState::ApplyLightIndex(&gl_RenderState,iVar2);
      }
    }
    else {
      iVar2 = FLightBuffer::GetIndex(GLRenderer->mLights,*(int *)p._12_8_);
      FRenderState::ApplyLightIndex(&gl_RenderState,iVar2);
      *(int *)p._12_8_ = *(int *)p._12_8_ + 1;
    }
  }
  return;
}

Assistant:

void GLFlat::SetupSubsectorLights(int pass, subsector_t * sub, int *dli)
{
	Plane p;

	if (renderstyle == STYLE_Add) return;	// no lights on additively blended surfaces.

	if (dli != NULL && *dli != -1)
	{
		gl_RenderState.ApplyLightIndex(GLRenderer->mLights->GetIndex(*dli));
		(*dli)++;
		return;
	}

	lightdata.Clear();
	FLightNode * node = sub->lighthead;
	while (node)
	{
		ADynamicLight * light = node->lightsource;
			
		if (light->flags2&MF2_DORMANT)
		{
			node=node->nextLight;
			continue;
		}
		iter_dlightf++;

		// we must do the side check here because gl_SetupLight needs the correct plane orientation
		// which we don't have for Legacy-style 3D-floors
		double planeh = plane.plane.ZatPoint(light);
		if (gl_lights_checkside && ((planeh<light->Z() && ceiling) || (planeh>light->Z() && !ceiling)))
		{
			node = node->nextLight;
			continue;
		}

		p.Set(plane.plane);
		gl_GetLight(sub->sector->PortalGroup, p, light, false, lightdata);
		node = node->nextLight;
	}

	int d = GLRenderer->mLights->UploadLights(lightdata);
	if (pass == GLPASS_LIGHTSONLY)
	{
		GLRenderer->mLights->StoreIndex(d);
	}
	else
	{
		gl_RenderState.ApplyLightIndex(d);
	}
}